

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall SQVM::ObjCmp(SQVM *this,SQObjectPtr *o1,SQObjectPtr *o2,SQInteger *result)

{
  float fVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  SQMetaMethod mm;
  SQOuter *pSVar7;
  SQOuter *pSVar8;
  float fVar9;
  SQObjectPtr res;
  SQObjectPtr closure;
  SQObjectPtr local_40;
  SQObjectPtr local_30;
  
  SVar2 = (o1->super_SQObject)._type;
  SVar3 = (o2->super_SQObject)._type;
  if (SVar2 == SVar3) {
    pSVar8 = (o1->super_SQObject)._unVal.pOuter;
    pSVar7 = (o2->super_SQObject)._unVal.pOuter;
    if (pSVar8 == pSVar7) goto LAB_0012a39a;
    local_40.super_SQObject._type = OT_NULL;
    local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
    if ((int)SVar2 < 0xa000020) {
      if (SVar2 == OT_INTEGER) {
        bVar4 = (long)pSVar7 <= (long)pSVar8;
      }
      else {
        if (SVar2 != OT_FLOAT) {
          if (SVar2 != OT_STRING) goto LAB_0012a495;
          iVar5 = strcmp((char *)&pSVar8->_idx,(char *)&pSVar7->_idx);
          uVar6 = (ulong)iVar5;
          goto LAB_0012a4a1;
        }
        bVar4 = SUB84(pSVar7,0) <= SUB84(pSVar8,0);
      }
      uVar6 = (ulong)bVar4 * 2 - 1;
    }
    else {
      if ((((SVar2 == OT_TABLE) || (SVar2 == OT_USERDATA)) || (SVar2 == OT_INSTANCE)) &&
         (pSVar8->_valptr != (SQObjectPtr *)0x0)) {
        local_30.super_SQObject._type = OT_NULL;
        local_30.super_SQObject._unVal.pTable = (SQTable *)0x0;
        iVar5 = (*(pSVar8->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[6])
                          (pSVar8,this,10);
        if ((char)iVar5 != '\0') {
          Push(this,o1);
          Push(this,o2);
          bVar4 = CallMetaMethod(this,&local_30,mm,2,&local_40);
          if (bVar4) {
            if (local_40.super_SQObject._type == OT_INTEGER) {
              *result = (SQInteger)local_40.super_SQObject._unVal;
              bVar4 = true;
            }
            else {
              bVar4 = false;
              Raise_Error(this,"_cmp must return an integer");
            }
          }
          else {
            bVar4 = false;
          }
          SQObjectPtr::~SQObjectPtr(&local_30);
          goto LAB_0012a4a6;
        }
        SQObjectPtr::~SQObjectPtr(&local_30);
        pSVar8 = (SQOuter *)(o1->super_SQObject)._unVal.pTable;
        pSVar7 = (SQOuter *)(o2->super_SQObject)._unVal.pTable;
      }
LAB_0012a495:
      uVar6 = -(ulong)(pSVar8 < pSVar7) | 1;
    }
LAB_0012a4a1:
    *result = uVar6;
    bVar4 = true;
LAB_0012a4a6:
    SQObjectPtr::~SQObjectPtr(&local_40);
    return bVar4;
  }
  if (((SVar2 & SVar3) >> 0x1a & 1) == 0) {
    if (SVar2 == OT_NULL) {
LAB_0012a44a:
      *result = -1;
      return true;
    }
    if (SVar3 != OT_NULL) {
      Raise_CompareError(this,&o1->super_SQObject,&o2->super_SQObject);
      return false;
    }
LAB_0012a453:
    *result = 1;
  }
  else {
    if (SVar3 == OT_FLOAT && SVar2 == OT_INTEGER) {
      fVar9 = (float)(o1->super_SQObject)._unVal.nInteger;
      fVar1 = (o2->super_SQObject)._unVal.fFloat;
      if ((fVar1 != fVar9) || (NAN(fVar1) || NAN(fVar9))) {
        if (fVar9 < fVar1) goto LAB_0012a44a;
        goto LAB_0012a453;
      }
    }
    else {
      fVar9 = (float)(o2->super_SQObject)._unVal.nInteger;
      fVar1 = (o1->super_SQObject)._unVal.fFloat;
      if ((fVar1 != fVar9) || (NAN(fVar1) || NAN(fVar9))) {
        if (fVar1 < fVar9) goto LAB_0012a44a;
        goto LAB_0012a453;
      }
    }
LAB_0012a39a:
    *result = 0;
  }
  return true;
}

Assistant:

bool SQVM::ObjCmp(const SQObjectPtr &o1,const SQObjectPtr &o2,SQInteger &result)
{
    SQObjectType t1 = type(o1), t2 = type(o2);
    if(t1 == t2) {
        if(_rawval(o1) == _rawval(o2))_RET_SUCCEED(0);
        SQObjectPtr res;
        switch(t1){
        case OT_STRING:
            _RET_SUCCEED(scstrcmp(_stringval(o1),_stringval(o2)));
        case OT_INTEGER:
            _RET_SUCCEED((_integer(o1)<_integer(o2))?-1:1);
        case OT_FLOAT:
            _RET_SUCCEED((_float(o1)<_float(o2))?-1:1);
        case OT_TABLE:
        case OT_USERDATA:
        case OT_INSTANCE:
            if(_delegable(o1)->_delegate) {
                SQObjectPtr closure;
                if(_delegable(o1)->GetMetaMethod(this, MT_CMP, closure)) {
                    Push(o1);Push(o2);
                    if(CallMetaMethod(closure,MT_CMP,2,res)) {
                        if(type(res) != OT_INTEGER) {
                            Raise_Error(_SC("_cmp must return an integer"));
                            return false;
                        }
                        _RET_SUCCEED(_integer(res))
                    }
                    return false;
                }
            }
            //continues through (no break needed)
        default:
            _RET_SUCCEED( _userpointer(o1) < _userpointer(o2)?-1:1 );
        }
        assert(0);
        //if(type(res)!=OT_INTEGER) { Raise_CompareError(o1,o2); return false; }
        //  _RET_SUCCEED(_integer(res));

    }
    else{
        if(sq_isnumeric(o1) && sq_isnumeric(o2)){
            if((t1==OT_INTEGER) && (t2==OT_FLOAT)) {
                if( _integer(o1)==_float(o2) ) { _RET_SUCCEED(0); }
                else if( _integer(o1)<_float(o2) ) { _RET_SUCCEED(-1); }
                _RET_SUCCEED(1);
            }
            else{
                if( _float(o1)==_integer(o2) ) { _RET_SUCCEED(0); }
                else if( _float(o1)<_integer(o2) ) { _RET_SUCCEED(-1); }
                _RET_SUCCEED(1);
            }
        }
        else if(t1==OT_NULL) {_RET_SUCCEED(-1);}
        else if(t2==OT_NULL) {_RET_SUCCEED(1);}
        else { Raise_CompareError(o1,o2); return false; }

    }
    assert(0);
    _RET_SUCCEED(0); //cannot happen
}